

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmArea.c
# Opt level: O3

int Abc_ObjChangeEval(Abc_Obj_t *pObj,Vec_Int_t *vInfo,Vec_Int_t *vFirst,int InvArea,int *pfUseInv)

{
  int *piVar1;
  void **ppvVar2;
  Abc_Obj_t *pNode;
  uint uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  int local_50;
  
  uVar3 = Mio_GateReadCell((Mio_Gate_t *)(pObj->field_5).pData);
  if ((-1 < (int)uVar3) && ((int)uVar3 < vFirst->nSize)) {
    lVar6 = (long)vFirst->pArray[uVar3];
    if ((lVar6 < 0) || (vInfo->nSize <= vFirst->pArray[uVar3])) {
LAB_00523149:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
    }
    piVar1 = vInfo->pArray;
    uVar3 = (pObj->vFanins).nSize;
    iVar4 = Abc_NodeIsInv(pObj);
    if ((int)uVar3 < 1) {
      __assert_fail("iFanin > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmArea.c"
                    ,0xe2,"int Abc_ObjChangeEval(Abc_Obj_t *, Vec_Int_t *, Vec_Int_t *, int, int *)"
                   );
    }
    *pfUseInv = 0;
    if (piVar1[lVar6 + (ulong)uVar3 * 3] == -1) {
LAB_005230f5:
      local_50 = 0;
    }
    else {
      local_50 = InvArea;
      if (iVar4 == 0) {
        local_50 = piVar1[lVar6 + (ulong)uVar3 * 3 + 2];
      }
      if ((pObj->vFanouts).nSize < 1) {
        iVar8 = 0;
        InvArea = 0;
      }
      else {
        lVar6 = 0;
        iVar8 = 0;
        do {
          ppvVar2 = pObj->pNtk->vObjs->pArray;
          pNode = (Abc_Obj_t *)ppvVar2[(pObj->vFanouts).pArray[lVar6]];
          if ((iVar4 != 0) &&
             (iVar5 = Abc_NodeFindFanin(pNode,(Abc_Obj_t *)ppvVar2[*(pObj->vFanins).pArray]),
             -1 < iVar5)) goto LAB_005230f5;
          iVar5 = Abc_ObjHasDupFanins(pNode);
          if (iVar5 != 0) {
            return 0;
          }
          if (((*(uint *)&pNode->field_0x14 & 0xf) == 7) &&
             (iVar5 = Abc_NodeIsBuf(pNode), iVar5 == 0)) {
            iVar5 = Abc_NodeIsInv(pNode);
            if (iVar5 == 0) {
              uVar3 = Mio_GateReadCell((Mio_Gate_t *)(pNode->field_5).pData);
              if (((int)uVar3 < 0) || (vFirst->nSize <= (int)uVar3)) goto LAB_0052312a;
              lVar7 = (long)vFirst->pArray[uVar3];
              if ((lVar7 < 0) || (vInfo->nSize <= vFirst->pArray[uVar3])) goto LAB_00523149;
              piVar1 = vInfo->pArray;
              iVar5 = Abc_NodeFindFanin(pNode,pObj);
              if (piVar1[lVar7 + iVar5 * 3] == -1) goto LAB_0052303c;
              local_50 = local_50 + piVar1[lVar7 + (long)(iVar5 * 3) + 2];
            }
            else {
              iVar5 = Abc_NodeCheckFanoutHasFanin(pNode,pObj);
              if (-1 < iVar5) {
                return 0;
              }
              local_50 = local_50 + InvArea;
            }
          }
          else {
LAB_0052303c:
            iVar8 = 1;
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 < (pObj->vFanouts).nSize);
        if (iVar8 == 0) {
          InvArea = 0;
        }
      }
      local_50 = local_50 - InvArea;
      *pfUseInv = iVar8;
    }
    return local_50;
  }
LAB_0052312a:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Abc_ObjChangeEval( Abc_Obj_t * pObj, Vec_Int_t * vInfo, Vec_Int_t * vFirst, int InvArea, int * pfUseInv )
{
    Abc_Obj_t * pNext;
    //Mio_Gate_t * pGate = (Mio_Gate_t *)pObj->pData;
    int iFanCell, iNodeCell = Mio_GateReadCell( (Mio_Gate_t *)pObj->pData );
    int * pFanInfo, * pNodeInfo = Vec_IntEntryP( vInfo, Vec_IntEntry(vFirst, iNodeCell) );
    int i, fNeedInv = 0, Gain = 0, iFanin = Abc_ObjFaninNum(pObj), fUseInv = Abc_NodeIsInv(pObj);
    assert( iFanin > 0 );
    *pfUseInv = 0;
    if ( pNodeInfo[3*iFanin] == -1 )
        return 0;
    if ( fUseInv )
        Gain = InvArea;
    else
        Gain = pNodeInfo[3*iFanin+2];
    Abc_ObjForEachFanout( pObj, pNext, i )
    {
        if ( fUseInv && Abc_NodeFindFanin(pNext, Abc_ObjFanin0(pObj)) >= 0 )
            return 0;
        if ( Abc_ObjHasDupFanins(pNext) )
            return 0;
        if ( !Abc_ObjIsNode(pNext) || Abc_NodeIsBuf(pNext) )
        {
            fNeedInv = 1;
            continue;
        }
        if ( Abc_NodeIsInv(pNext) )
        {
            if ( Abc_NodeCheckFanoutHasFanin(pNext, pObj) >= 0 )
                return 0;
            Gain += InvArea;
            continue;
        }
        iFanCell = Mio_GateReadCell( (Mio_Gate_t *)pNext->pData );
        pFanInfo = Vec_IntEntryP( vInfo, Vec_IntEntry(vFirst, iFanCell) );
        iFanin   = Abc_NodeFindFanin( pNext, pObj );
        if ( pFanInfo[3*iFanin] == -1 )
        {
            fNeedInv = 1;
            continue;
        }
        Gain += pFanInfo[3*iFanin+2];
    }
    if ( fNeedInv )
        Gain -= InvArea;
    *pfUseInv = fNeedInv;
    return Gain;
}